

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O1

double __thiscall
duckdb::VectorTryCastOperator<duckdb::VarintToDoubleCast>::Operation<duckdb::string_t,double>
          (VectorTryCastOperator<duckdb::VarintToDoubleCast> *this,string_t input,ValidityMask *mask
          ,idx_t idx,void *dataptr)

{
  bool bVar1;
  ValidityMask *pVVar2;
  string_t input_00;
  double output;
  bool local_61;
  double local_60;
  double local_58;
  anon_union_16_2_67f50693_for_value local_50;
  VectorTryCastOperator<duckdb::VarintToDoubleCast> local_40 [16];
  
  local_61 = false;
  pVVar2 = mask;
  local_50._0_8_ = this;
  local_50.pointer.ptr = input.value._0_8_;
  bVar1 = Varint::VarintToDouble((string_t *)&local_50.pointer,&local_58,&local_61);
  local_60 = local_58;
  if (!bVar1) {
    input_00.value.pointer.ptr = (char *)pVVar2;
    input_00.value._0_8_ = input.value._0_8_;
    CastExceptionText<duckdb::string_t,double>((string *)&local_50.pointer,(duckdb *)this,input_00);
    local_60 = HandleVectorCastError::Operation<double>
                         ((string *)&local_50.pointer,input.value._8_8_,(idx_t)mask,
                          (VectorTryCastData *)idx);
    if ((VectorTryCastOperator<duckdb::VarintToDoubleCast> *)local_50._0_8_ != local_40) {
      operator_delete((void *)local_50._0_8_);
    }
  }
  return local_60;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output))) {
			return output;
		}
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}